

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_cpplint.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_20;
  uint local_1c;
  int i;
  int error;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  for (local_20 = 1; local_20 < argc; local_20 = local_20 + 1) {
    iVar1 = strcmp(argv[local_20],"--error");
    if (iVar1 == 0) {
      local_1c = 1;
    }
    if (*argv[local_20] != '-') {
      if (local_1c != 0) {
        fprintf(_stderr,"%s:0:  message  [category/category] [0]\n",argv[local_20]);
      }
      fprintf(_stdout,"Done processing %s\nTotal errors found: %i\n",argv[local_20],(ulong)local_1c)
      ;
    }
  }
  return local_1c;
}

Assistant:

int main(int argc, char* argv[])
{
  int error = 0;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "--error") == 0) {
      error = 1;
    }
    if (argv[i][0] != '-') {
      if (error) {
        fprintf(stderr, "%s:0:  message  [category/category] [0]\n", argv[i]);
      }
      fprintf(stdout, "Done processing %s\nTotal errors found: %i\n", argv[i],
              error);
    }
  }
  return error;
}